

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# outputtype.cpp
# Opt level: O0

CTxDestination *
AddAndGetDestinationForScript(FlatSigningProvider *keystore,CScript *script,OutputType type)

{
  map<CScriptID,_CScript,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
  *this;
  int in_ECX;
  undefined1 uVar1;
  long in_RSI;
  CTxDestination *in_RDI;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::pair<const_CScriptID,_CScript>_>,_bool> pVar2;
  CScript witprog;
  CTxDestination witdest;
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  *in_stack_fffffffffffffe68;
  WitnessV0ScriptHash *in_stack_fffffffffffffe70;
  undefined7 in_stack_fffffffffffffe78;
  undefined1 in_stack_fffffffffffffe7f;
  CScriptID *in_stack_fffffffffffffe80;
  map<CScriptID,_CScript,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
  *in_stack_fffffffffffffe88;
  WitnessV0ScriptHash local_a0 [4];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  CScriptID::CScriptID
            (in_stack_fffffffffffffe80,
             (CScript *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
  std::
  map<CScriptID,CScript,std::less<CScriptID>,std::allocator<std::pair<CScriptID_const,CScript>>>::
  emplace<CScriptID,CScript_const&>
            (in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
             (CScript *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
  if (in_ECX == 0) {
    ScriptHash::ScriptHash
              ((ScriptHash *)in_stack_fffffffffffffe80,
               (CScript *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
    std::
    variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
    ::variant<ScriptHash,void,void,ScriptHash,void>
              ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78),
               (ScriptHash *)in_stack_fffffffffffffe70);
  }
  else {
    if (1 < in_ECX - 1U) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/outputtype.cpp"
                    ,0x6b,
                    "CTxDestination AddAndGetDestinationForScript(FlatSigningProvider &, const CScript &, OutputType)"
                   );
    }
    WitnessV0ScriptHash::WitnessV0ScriptHash(local_a0,(CScript *)in_stack_fffffffffffffe88);
    std::
    variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
    ::variant<WitnessV0ScriptHash,void,void,WitnessV0ScriptHash,void>
              ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78),
               in_stack_fffffffffffffe70);
    GetScriptForDestination(in_stack_fffffffffffffe68);
    this = (map<CScriptID,_CScript,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
            *)(in_RSI + 8);
    CScriptID::CScriptID
              (in_stack_fffffffffffffe80,
               (CScript *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
    pVar2 = std::
            map<CScriptID,CScript,std::less<CScriptID>,std::allocator<std::pair<CScriptID_const,CScript>>>
            ::emplace<CScriptID,CScript&>
                      (this,in_stack_fffffffffffffe80,
                       (CScript *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
    uVar1 = pVar2.second;
    if (in_ECX == 2) {
      std::
      variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      ::variant(in_stack_fffffffffffffe68,
                (variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                 *)0x3542c6);
    }
    else {
      ScriptHash::ScriptHash
                ((ScriptHash *)pVar2.first._M_node._M_node,
                 (CScript *)CONCAT17(uVar1,in_stack_fffffffffffffe78));
      std::
      variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
      ::variant<ScriptHash,void,void,ScriptHash,void>
                ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                  *)CONCAT17(uVar1,in_stack_fffffffffffffe78),
                 (ScriptHash *)in_stack_fffffffffffffe70);
    }
    CScript::~CScript((CScript *)in_stack_fffffffffffffe68);
    std::
    variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    ::~variant(in_stack_fffffffffffffe68);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

CTxDestination AddAndGetDestinationForScript(FlatSigningProvider& keystore, const CScript& script, OutputType type)
{
    // Add script to keystore
    keystore.scripts.emplace(CScriptID(script), script);

    switch (type) {
    case OutputType::LEGACY:
        return ScriptHash(script);
    case OutputType::P2SH_SEGWIT:
    case OutputType::BECH32: {
        CTxDestination witdest = WitnessV0ScriptHash(script);
        CScript witprog = GetScriptForDestination(witdest);
        // Add the redeemscript, so that P2WSH and P2SH-P2WSH outputs are recognized as ours.
        keystore.scripts.emplace(CScriptID(witprog), witprog);
        if (type == OutputType::BECH32) {
            return witdest;
        } else {
            return ScriptHash(witprog);
        }
    }
    case OutputType::BECH32M:
    case OutputType::UNKNOWN: {} // This function should not be used for BECH32M or UNKNOWN, so let it assert
    } // no default case, so the compiler can warn about missing cases
    assert(false);
}